

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_exception_inst_addr_mis(DisasContext_conflict12 *ctx)

{
  TCGContext_conflict11 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  tcg_gen_op2_riscv64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->cpu_pc + (long)tcg_ctx),
                      (ctx->base).pc_next);
  tcg_gen_op3_riscv64(tcg_ctx,INDEX_op_st_i64,(TCGArg)(tcg_ctx->cpu_pc + (long)tcg_ctx),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x220);
  pTVar1 = tcg_const_i32_riscv64(tcg_ctx,0);
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_riscv64(tcg_ctx,helper_raise_exception_riscv64,(TCGTemp *)0x0,2,&local_28);
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_exception_inst_addr_mis(DisasContext *ctx)
{
    generate_exception_mbadaddr(ctx, RISCV_EXCP_INST_ADDR_MIS);
}